

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

void __thiscall covenant::CFG::check_well_formed(CFG *this)

{
  long lVar1;
  ostream *poVar2;
  pointer pSVar3;
  pointer pvVar4;
  pointer pSVar5;
  size_t __n;
  int iVar6;
  void *__buf;
  Sym s;
  pointer pvVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  CFG local_228;
  ostringstream error_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_msg);
  uVar9 = 0;
  bVar12 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar12) {
    poVar2 = std::operator<<((ostream *)&error_msg,
                             "ERROR: grammar must have at least one production rule.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  s.x = 1;
  while( true ) {
    uVar8 = (ulong)uVar9;
    pvVar7 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pvVar4 - (long)pvVar7) / 0x18) <= uVar8) break;
    if (*(pointer *)
         ((long)&pvVar7[uVar8].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data + 8) ==
        pvVar7[uVar8].
        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&error_msg,"ERROR: ");
      poVar2 = operator<<(poVar2,s);
      std::operator<<(poVar2," non-terminal symbol without rule.\n");
      bVar12 = true;
      std::operator<<((ostream *)&error_msg,
                      "Also possible a terminal misinterpreted as nonterminal.\n");
    }
    uVar9 = uVar9 + 1;
    s.x = s.x + 2;
  }
  uVar9 = 0;
  while( true ) {
    uVar8 = (ulong)uVar9;
    __n = 0x18;
    if (((ulong)(((long)pvVar4 - (long)pvVar7) / 0x18) <= uVar8) || (bVar12)) break;
    uVar11 = 0;
    while( true ) {
      lVar1 = *(long *)&pvVar7[uVar8].
                        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                        ._M_impl.super__Vector_impl_data;
      if (((ulong)((long)*(pointer *)
                          ((long)&pvVar7[uVar8].
                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                  ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 2) <=
           (ulong)uVar11) || (bVar12)) break;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                (&RHS,(this->rules).
                      super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      *(int *)(lVar1 + (ulong)uVar11 * 4));
      if (RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 0;
        pSVar3 = RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar5 = RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        while (((ulong)uVar10 < (ulong)((long)pSVar5 - (long)pSVar3 >> 2) && (!bVar12))) {
          if ((pSVar3[uVar10].x & 1U) == 0) {
            iVar6 = pSVar3[uVar10].x >> 1;
            if ((iVar6 < this->alphstart) || (this->alphstart + this->alphsz <= iVar6)) {
              std::operator<<((ostream *)&error_msg,"ERROR: some terminal symbol is out of range. ")
              ;
              poVar2 = std::operator<<((ostream *)&error_msg,"It must be between ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->alphstart);
              poVar2 = std::operator<<(poVar2," and ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->alphsz + this->alphstart);
              std::endl<char,std::char_traits<char>>(poVar2);
              bVar12 = true;
              pSVar3 = RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                       .super__Vector_impl_data._M_start;
              pSVar5 = RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                       .super__Vector_impl_data._M_finish;
            }
          }
          uVar10 = uVar10 + 1;
        }
      }
      std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                (&RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
      uVar11 = uVar11 + 1;
      pvVar7 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar9 = uVar9 + 1;
    pvVar4 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (bVar12) {
    CFG(&local_228,this);
    write(&local_228,0x1bf2b0,__buf,__n);
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&RHS);
    std::__cxx11::string::~string((string *)&RHS);
    ~CFG(&local_228);
    exit(1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_msg);
  return;
}

Assistant:

inline void check_well_formed()
    {
      bool error=false;
      ostringstream error_msg;
      if (prods.size() == 0)
      {
        error=true;
        error_msg << "ERROR: grammar must have at least one production rule." << endl;
      }
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        if (prods[vv].size() == 0){
          error=true;
          error_msg << "ERROR: " 
                    << Sym::mkVar(vv) << " non-terminal symbol without rule.\n"; 
          error_msg << "Also possible a terminal misinterpreted as nonterminal.\n";
        }
      }
      for ( unsigned int vv = 0; (vv < prods.size() && !error); vv++ )
      {
        for ( unsigned int ri = 0; (ri < prods[vv].size() && !error); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 0) continue;
          for (unsigned k=0; ( k < RHS.size() && !error) ;k++)
          {
            if (RHS[k].isTerm () && 
                !(RHS[k].symID () >= alphstart && 
                  RHS[k].symID()  <  alphstart+alphsz)){
              error=true;
              error_msg << "ERROR: some terminal symbol is out of range. ";
              error_msg << "It must be between " << alphstart << " and " << alphstart+alphsz << endl;   
            }
          }
        }
      }
      if (error)
      {
        cout << *this << endl << error_msg.str();
        exit(1);
      }
    }